

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O2

string * SDT::writeLabel(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_30;
  
  cntTemp = cntTemp + 1;
  std::__cxx11::to_string(&local_30,cntTemp);
  std::operator+(in_RDI,"_t",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

string newtemp(){
        return "_t"+to_string(++cntTemp);
    }